

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.hpp
# Opt level: O1

vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> * sift::read_test(void)

{
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_RDI;
  string fn_images_test;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"sift_query.fvecs","");
  read_vectors(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

static std::vector<point_type> read_test() {
    std::string fn_images_test = "sift_query.fvecs";
    return read_vectors(fn_images_test);
  }